

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  int iVar4;
  Value *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int index_1;
  int lineLength;
  Value *childValue;
  int index;
  bool isMultiLine;
  int size;
  int in_stack_0000016c;
  Value *in_stack_00000170;
  Value *in_stack_00000208;
  StyledStreamWriter *in_stack_00000210;
  Value *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 in_stack_ffffffffffffffc6;
  byte bVar5;
  int local_30;
  int local_2c;
  Value *in_stack_ffffffffffffffd8;
  int local_1c;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar6;
  
  AVar2 = Value::size(in_stack_ffffffffffffffd8);
  uVar6 = CONCAT13(*(int *)&in_RDI[2].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage <= (int)(AVar2 * 3),
                   (int3)in_stack_ffffffffffffffe8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1697b1);
  local_1c = 0;
  do {
    bVar5 = 0;
    if (local_1c < (int)AVar2) {
      bVar5 = (byte)(uVar6 >> 0x18) ^ 0xff;
    }
    if ((bVar5 & 1) == 0) {
      if ((uVar6 & 0x1000000) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(in_RSI,CONCAT44(AVar2,uVar6));
        *(byte *)&in_RDI[4].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
             *(byte *)&in_RDI[4].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish & 0xfe | 1;
        local_2c = (AVar2 - 1) * 2 + 4;
        for (local_30 = 0; local_30 < (int)AVar2; local_30 = local_30 + 1) {
          Value::operator[](in_stack_00000170,in_stack_0000016c);
          bVar1 = hasCommentForValue((StyledStreamWriter *)
                                     CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffffc6,
                                                             CONCAT15(in_stack_ffffffffffffffc5,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0)))),
                                     in_stack_ffffffffffffffb8);
          if (bVar1) {
            uVar6 = 0x1000000;
          }
          Value::operator[](in_stack_00000170,in_stack_0000016c);
          writeValue(in_stack_00000210,in_stack_00000208);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](in_RDI,(long)local_30);
          iVar4 = std::__cxx11::string::length();
          local_2c = iVar4 + local_2c;
        }
        *(byte *)&in_RDI[4].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
             *(byte *)&in_RDI[4].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish & 0xfe;
        bVar1 = true;
        if ((uVar6 & 0x1000000) == 0) {
          bVar1 = *(int *)&in_RDI[2].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage <= local_2c;
        }
        uVar6 = (uint)bVar1 << 0x18;
      }
      return (bool)((byte)(uVar6 >> 0x18) & 1);
    }
    this_00 = Value::operator[](in_stack_00000170,in_stack_0000016c);
    in_stack_ffffffffffffffc6 = true;
    if ((uVar6 & 0x1000000) == 0) {
      bVar1 = Value::isArray(this_00);
      if (!bVar1) {
        bVar1 = Value::isObject(this_00);
        in_stack_ffffffffffffffc5 = false;
        in_stack_ffffffffffffffc6 = in_stack_ffffffffffffffc5;
        if (!bVar1) goto LAB_00169840;
      }
      AVar3 = Value::size(this_00);
      in_stack_ffffffffffffffc5 = AVar3 != 0;
      in_stack_ffffffffffffffc6 = in_stack_ffffffffffffffc5;
    }
LAB_00169840:
    uVar6 = CONCAT13(in_stack_ffffffffffffffc6,(int3)uVar6);
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}